

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

bool __thiscall cfd::core::Script::IsPegoutScript(Script *this)

{
  ScriptElementType SVar1;
  pointer pSVar2;
  size_t sVar3;
  ulong uVar4;
  ScriptElementType *pSVar5;
  bool bVar6;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  sVar3 = ByteData::GetDataSize(&this->script_data_);
  if (((1 < sVar3) &&
      (pSVar2 = (this->script_stack_).
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (pSVar2->op_code_).data_type_ == ScriptOperator::OP_RETURN._8_4_)) &&
     (pSVar2[1].type_ == kElementBinary)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,
               &pSVar2[1].binary_data_.data_);
    sVar3 = ByteData::GetDataSize((ByteData *)&_Stack_28);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
    if (sVar3 == 0x20) {
      pSVar2 = (this->script_stack_).
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = &pSVar2[2].type_;
      uVar4 = 1;
      do {
        uVar4 = uVar4 + 1;
        bVar6 = (ulong)(((long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x60) <=
                uVar4;
        if (bVar6) {
          return bVar6;
        }
        SVar1 = *pSVar5;
        pSVar5 = pSVar5 + 0x18;
      } while (SVar1 == kElementBinary);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool Script::IsPegoutScript() const {
  if ((script_data_.GetDataSize() < 2) ||
      (script_stack_[0].GetOpCode() != ScriptOperator::OP_RETURN)) {
    return false;
  }

  if (!script_stack_[1].IsBinary() ||
      script_stack_[1].GetBinaryData().GetDataSize() != kByteData256Length) {
    return false;
  }

  for (size_t i = 2; i < script_stack_.size(); ++i) {
    if (!script_stack_[i].IsBinary()) {
      return false;
    }
  }

  return true;
}